

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_hd.c
# Opt level: O2

void nghttp2_hd_entry_init(nghttp2_hd_entry *ent,nghttp2_hd_nv *nv)

{
  nghttp2_rcbuf *pnVar1;
  uint8_t uVar2;
  undefined3 uVar3;
  
  uVar2 = nv->flags;
  uVar3 = *(undefined3 *)&nv->field_0x15;
  (ent->nv).token = nv->token;
  (ent->nv).flags = uVar2;
  *(undefined3 *)&(ent->nv).field_0x15 = uVar3;
  pnVar1 = nv->value;
  (ent->nv).name = nv->name;
  (ent->nv).value = pnVar1;
  pnVar1 = nv->name;
  (ent->cnv).name = pnVar1->base;
  (ent->cnv).namelen = pnVar1->len;
  pnVar1 = nv->value;
  (ent->cnv).value = pnVar1->base;
  (ent->cnv).valuelen = pnVar1->len;
  (ent->cnv).flags = nv->flags;
  ent->next = (nghttp2_hd_entry *)0x0;
  ent->hash = 0;
  nghttp2_rcbuf_incref((ent->nv).name);
  nghttp2_rcbuf_incref((ent->nv).value);
  return;
}

Assistant:

void nghttp2_hd_entry_init(nghttp2_hd_entry *ent, nghttp2_hd_nv *nv) {
  ent->nv = *nv;
  ent->cnv.name = nv->name->base;
  ent->cnv.namelen = nv->name->len;
  ent->cnv.value = nv->value->base;
  ent->cnv.valuelen = nv->value->len;
  ent->cnv.flags = nv->flags;
  ent->next = NULL;
  ent->hash = 0;

  nghttp2_rcbuf_incref(ent->nv.name);
  nghttp2_rcbuf_incref(ent->nv.value);
}